

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

Extension * __thiscall
google::protobuf::internal::ExtensionSet::MaybeNewRepeatedExtension
          (ExtensionSet *this,FieldDescriptor *descriptor)

{
  Arena *this_00;
  bool bVar1;
  Type TVar2;
  Extension *in_RAX;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  Extension *pEVar4;
  Extension *extension;
  
  extension = in_RAX;
  bVar1 = MaybeNewExtension(this,*(int *)(descriptor + 0x44),descriptor,&extension);
  if (bVar1) {
    TVar2 = FieldDescriptor::type(descriptor);
    pEVar4 = extension;
    extension->type = (FieldType)TVar2;
    extension->is_repeated = true;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      pRVar3 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x18);
      (pRVar3->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      (pRVar3->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar3->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar3->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    else {
      Arena::AllocHook(this_00,(type_info *)
                               &RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,0x18);
      pRVar3 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)ArenaImpl::AllocateAlignedAndAddCleanup
                            (&this_00->impl_,0x18,
                             arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                            );
      (pRVar3->super_RepeatedPtrFieldBase).arena_ = this_00;
      (pRVar3->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar3->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar3->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      pEVar4 = extension;
    }
    (pEVar4->field_0).repeated_string_value = pRVar3;
  }
  return extension;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::MaybeNewRepeatedExtension(
    const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
        Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }
  return extension;
}